

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::PIQBase::VerifyGetProgramResourceIndex
          (PIQBase *this,GLuint program,GLenum programInterface,string *name,GLuint expected,
          long *error)

{
  GLuint GVar1;
  GLchar *name_00;
  GLuint res;
  long *error_local;
  GLuint expected_local;
  string *name_local;
  GLenum programInterface_local;
  GLuint program_local;
  PIQBase *this_local;
  
  name_00 = (GLchar *)std::__cxx11::string::c_str();
  GVar1 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
                     programInterface,name_00);
  if (GVar1 != expected) {
    anon_unknown_0::Output("ERROR: Got %d, expected %d\n",(ulong)GVar1,(ulong)expected);
    *error = -1;
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceIndex(GLuint program, GLenum programInterface, const std::string& name,
													  GLuint expected, long& error)
	{
		GLuint res = glGetProgramResourceIndex(program, programInterface, name.c_str());
		if (res != expected)
		{
			Output("ERROR: Got %d, expected %d\n", res, expected);
			error = ERROR;
		}
	}